

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O2

void __thiscall mp::BasicSolver::Print(BasicSolver *this,CStringRef format,ArgList *args)

{
  OutputHandler *pOVar1;
  char *pcVar2;
  MemoryWriter w;
  BasicMemoryWriter<char,_std::allocator<char>_> local_230;
  
  local_230.super_BasicWriter<char>.buffer_ = &local_230.buffer_.super_Buffer<char>;
  local_230.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_003993a0;
  local_230.buffer_.super_Buffer<char>.ptr_ = local_230.buffer_.data_;
  local_230.buffer_.super_Buffer<char>.size_ = 0;
  local_230.buffer_.super_Buffer<char>.capacity_ = 500;
  local_230.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_003993e8;
  fmt::BasicWriter<char>::write
            (&local_230.super_BasicWriter<char>,(int)format.data_,(void *)args->types_,
             (size_t)args->field_1);
  pOVar1 = this->output_handler_;
  pcVar2 = fmt::BasicWriter<char>::c_str(&local_230.super_BasicWriter<char>);
  (*pOVar1->_vptr_OutputHandler[2])(pOVar1,pcVar2);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_230);
  return;
}

Assistant:

void Print(fmt::CStringRef format, const fmt::ArgList &args) {
    fmt::MemoryWriter w;
    w.write(format, args);
    output_handler_->HandleOutput(w.c_str());
  }